

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O0

void __thiscall
DIS::LinearObjectStatePdu::marshal(LinearObjectStatePdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_88 [8];
  LinearSegmentParameter x;
  size_t idx;
  DataStream *dataStream_local;
  LinearObjectStatePdu *this_local;
  
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_objectID,dataStream);
  EntityID::marshal(&this->_referencedObjectID,dataStream);
  DataStream::operator<<(dataStream,this->_updateNumber);
  DataStream::operator<<(dataStream,this->_forceID);
  sVar2 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::
          size(&this->_linearSegmentParameters);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  SimulationAddress::marshal(&this->_requesterID,dataStream);
  SimulationAddress::marshal(&this->_receivingID,dataStream);
  ObjectType::marshal(&this->_objectType,dataStream);
  x._pad1 = 0;
  x._100_4_ = 0;
  while( true ) {
    uVar1 = x._96_8_;
    sVar2 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::
            size(&this->_linearSegmentParameters);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
             ::operator[](&this->_linearSegmentParameters,x._96_8_);
    LinearSegmentParameter::LinearSegmentParameter((LinearSegmentParameter *)local_88,pvVar3);
    LinearSegmentParameter::marshal((LinearSegmentParameter *)local_88,dataStream);
    LinearSegmentParameter::~LinearSegmentParameter((LinearSegmentParameter *)local_88);
    x._96_8_ = x._96_8_ + 1;
  }
  return;
}

Assistant:

void LinearObjectStatePdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _objectID.marshal(dataStream);
    _referencedObjectID.marshal(dataStream);
    dataStream << _updateNumber;
    dataStream << _forceID;
    dataStream << ( unsigned char )_linearSegmentParameters.size();
    _requesterID.marshal(dataStream);
    _receivingID.marshal(dataStream);
    _objectType.marshal(dataStream);

     for(size_t idx = 0; idx < _linearSegmentParameters.size(); idx++)
     {
        LinearSegmentParameter x = _linearSegmentParameters[idx];
        x.marshal(dataStream);
     }

}